

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O0

bool __thiscall
TCLAP::SwitchArg::processArg
          (SwitchArg *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  undefined8 uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  int *in_RSI;
  long *in_RDI;
  SwitchArg *in_stack_00000040;
  string *in_stack_00000070;
  string *in_stack_000000b0;
  string *in_stack_000000b8;
  CmdLineParseException *in_stack_000000c0;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  SwitchArg *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  bool local_1;
  
  if (((*(byte *)(in_RDI + 0x14) & 1) == 0) || (bVar1 = Arg::ignoreRest(), !bVar1)) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](in_RDX,(long)*in_RSI);
    uVar3 = (**(code **)(*in_RDI + 0x30))(in_RDI,pvVar2);
    if ((uVar3 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDX,(long)*in_RSI);
      bVar1 = combinedSwitchesMatch((SwitchArg *)args,in_stack_00000070);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDX,(long)*in_RSI);
        bVar1 = combinedSwitchesMatch((SwitchArg *)args,in_stack_00000070);
        if (bVar1) {
          uVar4 = __cxa_allocate_exception(0x68);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          (**(code **)(*in_RDI + 0x38))(&stack0xffffffffffffff88);
          CmdLineParseException::CmdLineParseException
                    (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
          __cxa_throw(uVar4,&CmdLineParseException::typeinfo,
                      CmdLineParseException::~CmdLineParseException);
        }
        commonProcessing(in_stack_00000040);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDX,(long)*in_RSI);
        local_1 = lastCombined(in_stack_ffffffffffffff88,
                               (string *)
                               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      }
      else {
        local_1 = false;
      }
    }
    else {
      commonProcessing(in_stack_00000040);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool SwitchArg::processArg(int *i, std::vector<std::string>& args)
{
	if ( _ignoreable && Arg::ignoreRest() )
		return false;

	// if the whole string matches the flag or name string
	if ( argMatches( args[*i] ) )
	{
		commonProcessing();

		return true;
	}
	// if a substring matches the flag as part of a combination
	else if ( combinedSwitchesMatch( args[*i] ) )
	{
		// check again to ensure we don't misinterpret 
		// this as a MultiSwitchArg 
		if ( combinedSwitchesMatch( args[*i] ) )
			throw(CmdLineParseException("Argument already set!", 
			                            toString()));

		commonProcessing();

		// We only want to return true if we've found the last combined
		// match in the string, otherwise we return true so that other 
		// switches in the combination will have a chance to match.
		return lastCombined( args[*i] );
	}
	else
		return false;
}